

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O1

xmlRegAtomPtr xmlRegCopyAtom(xmlRegParserCtxtPtr ctxt,xmlRegAtomPtr atom)

{
  int iVar1;
  xmlRegAtomType xVar2;
  int iVar3;
  int iVar4;
  xmlRegRangePtr pxVar5;
  xmlRegAtomPtr atom_00;
  xmlRegRangePtr *ppxVar6;
  xmlRegRangePtr pxVar7;
  xmlChar *pxVar8;
  long lVar9;
  
  atom_00 = (xmlRegAtomPtr)(*xmlMalloc)(0x60);
  if (atom_00 == (xmlRegAtomPtr)0x0) {
    xmlRegexpErrMemory(ctxt,"copying atom");
  }
  else {
    atom_00->ranges = (xmlRegRangePtr *)0x0;
    atom_00->data = (void *)0x0;
    atom_00->stop = (xmlRegStatePtr)0x0;
    atom_00->maxRanges = 0;
    atom_00->nbRanges = 0;
    atom_00->start = (xmlRegStatePtr)0x0;
    atom_00->start0 = (xmlRegStatePtr)0x0;
    atom_00->valuep2 = (void *)0x0;
    atom_00->neg = 0;
    atom_00->codepoint = 0;
    *(undefined8 *)&atom_00->max = 0;
    atom_00->valuep = (void *)0x0;
    atom_00->no = 0;
    atom_00->type = 0;
    atom_00->quant = 0;
    atom_00->min = 0;
    atom_00->type = atom->type;
    atom_00->quant = atom->quant;
    atom_00->min = atom->min;
    atom_00->max = atom->max;
    if ((long)atom->nbRanges < 1) {
      return atom_00;
    }
    ppxVar6 = (xmlRegRangePtr *)(*xmlMalloc)((long)atom->nbRanges << 3);
    atom_00->ranges = ppxVar6;
    if (ppxVar6 != (xmlRegRangePtr *)0x0) {
      if (atom->nbRanges < 1) {
        return atom_00;
      }
      lVar9 = 0;
      do {
        pxVar5 = atom->ranges[lVar9];
        if (pxVar5 == (xmlRegRangePtr)0x0) {
LAB_001ad848:
          pxVar7 = (xmlRegRangePtr)0x0;
        }
        else {
          iVar1 = pxVar5->neg;
          xVar2 = pxVar5->type;
          iVar3 = pxVar5->start;
          iVar4 = pxVar5->end;
          pxVar7 = (xmlRegRangePtr)(*xmlMalloc)(0x18);
          if (pxVar7 == (xmlRegRangePtr)0x0) {
            xmlRegexpErrMemory(ctxt,"allocating range");
            pxVar7 = (xmlRegRangePtr)0x0;
          }
          else {
            pxVar7->neg = iVar1;
            pxVar7->type = xVar2;
            pxVar7->start = iVar3;
            pxVar7->end = iVar4;
          }
          if (pxVar7 == (xmlRegRangePtr)0x0) goto LAB_001ad848;
          if (pxVar5->blockName != (xmlChar *)0x0) {
            pxVar8 = xmlStrdup(pxVar5->blockName);
            pxVar7->blockName = pxVar8;
            if (pxVar8 == (xmlChar *)0x0) {
              xmlRegexpErrMemory(ctxt,"allocating range");
              if (pxVar7->blockName != (xmlChar *)0x0) {
                (*xmlFree)(pxVar7->blockName);
              }
              (*xmlFree)(pxVar7);
              goto LAB_001ad848;
            }
          }
        }
        atom_00->ranges[lVar9] = pxVar7;
        if (atom_00->ranges[lVar9] == (xmlRegRangePtr)0x0) goto LAB_001ad894;
        lVar9 = lVar9 + 1;
        atom_00->nbRanges = (int)lVar9;
        if (atom->nbRanges <= lVar9) {
          return atom_00;
        }
      } while( true );
    }
    xmlRegexpErrMemory(ctxt,"copying atom");
LAB_001ad894:
    xmlRegFreeAtom(atom_00);
  }
  return (xmlRegAtomPtr)0x0;
}

Assistant:

static xmlRegAtomPtr
xmlRegCopyAtom(xmlRegParserCtxtPtr ctxt, xmlRegAtomPtr atom) {
    xmlRegAtomPtr ret;

    ret = (xmlRegAtomPtr) xmlMalloc(sizeof(xmlRegAtom));
    if (ret == NULL) {
	xmlRegexpErrMemory(ctxt, "copying atom");
	return(NULL);
    }
    memset(ret, 0, sizeof(xmlRegAtom));
    ret->type = atom->type;
    ret->quant = atom->quant;
    ret->min = atom->min;
    ret->max = atom->max;
    if (atom->nbRanges > 0) {
        int i;

        ret->ranges = (xmlRegRangePtr *) xmlMalloc(sizeof(xmlRegRangePtr) *
	                                           atom->nbRanges);
	if (ret->ranges == NULL) {
	    xmlRegexpErrMemory(ctxt, "copying atom");
	    goto error;
	}
	for (i = 0;i < atom->nbRanges;i++) {
	    ret->ranges[i] = xmlRegCopyRange(ctxt, atom->ranges[i]);
	    if (ret->ranges[i] == NULL)
	        goto error;
	    ret->nbRanges = i + 1;
	}
    }
    return(ret);

error:
    xmlRegFreeAtom(ret);
    return(NULL);
}